

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodePtr __thiscall Parser::ParseImport<false>(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  ScriptConfiguration *pSVar3;
  undefined4 *puVar4;
  Scanner_t *pSVar5;
  ParseNodePtr pPVar6;
  IdentPtr moduleSpecifier;
  undefined1 local_a0 [8];
  ModuleImportOrExportEntryList importEntryList;
  undefined1 local_80 [4];
  BOOL fCanAssign_1;
  IdentToken token;
  BOOL fCanAssign;
  ParseNodePtr pnode;
  RestorePoint parsedImport;
  charcount_t ichMin;
  Parser *this_local;
  
  pSVar3 = Js::ScriptContext::GetConfig(this->m_scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6ModuleEnabled(pSVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac7,"(m_scriptContext->GetConfig()->IsES6ModuleEnabled())",
                       "m_scriptContext->GetConfig()->IsES6ModuleEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->m_token).tk != tkIMPORT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac8,"(m_token.tk == tkIMPORT)","m_token.tk == tkIMPORT");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = GetScanner(this);
  parsedImport.m_cMultiUnits._4_4_ = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar5);
  RestorePoint::RestorePoint((RestorePoint *)&pnode);
  pSVar5 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar5,(RestorePoint *)&pnode);
  pSVar5 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
  if ((this->m_token).tk == tkLParen) {
    pSVar3 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar2 = Js::ScriptConfiguration::IsESDynamicImportEnabled(pSVar3);
    if (!bVar2) {
      Error(this,-0x7ff5fbb7,L"",L"");
    }
    pPVar6 = ParseImportCall<false>(this);
    IdentToken::IdentToken((IdentToken *)local_80);
    this_local = (Parser *)
                 ParsePostfixOperators<false>
                           (this,pPVar6,1,0,0,1,(BOOL *)&token.ichLim,(IdentToken *)local_80,
                            (bool *)0x0);
  }
  else {
    if ((this->m_token).tk == tkDot) {
      pSVar3 = Js::ScriptContext::GetConfig(this->m_scriptContext);
      bVar2 = Js::ScriptConfiguration::IsESImportMetaEnabled(pSVar3);
      if (bVar2) {
        ParseMetaProperty<false>
                  (this,tkIMPORT,parsedImport.m_cMultiUnits._4_4_,
                   (BOOL *)((long)&importEntryList.allocator + 4));
        pSVar5 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar5,(RestorePoint *)&pnode);
        pPVar6 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                                  (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0
                                 );
        return pPVar6;
      }
    }
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar5,(RestorePoint *)&pnode);
    CheckIfImportOrExportStatementValidHere(this);
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
    if ((this->m_token).tk == tkStrCon) {
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
    }
    else {
      SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::SList
                ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_a0,
                 &this->m_nodeAllocator);
      ParseImportClause<false>
                (this,(SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                      local_a0,false);
      ParseImportOrExportFromClause<false>(this,true);
      SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Clear
                ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_a0);
      SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::~SList
                ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_a0);
    }
    this_local = (Parser *)0x0;
  }
  return (ParseNodePtr)this_local;
}

Assistant:

ParseNodePtr Parser::ParseImport()
{
    Assert(m_scriptContext->GetConfig()->IsES6ModuleEnabled());
    Assert(m_token.tk == tkIMPORT);

    charcount_t ichMin = this->GetScanner()->IchMinTok();
    RestorePoint parsedImport;
    this->GetScanner()->Capture(&parsedImport);
    this->GetScanner()->Scan();

    // import()
    if (m_token.tk == tkLParen)
    {
        if (!m_scriptContext->GetConfig()->IsESDynamicImportEnabled())
        {
            Error(ERRExperimental);
        }

        ParseNodePtr pnode = ParseImportCall<buildAST>();
        BOOL fCanAssign;
        IdentToken token;
        return ParsePostfixOperators<buildAST>(pnode, TRUE, FALSE, FALSE, TRUE, &fCanAssign, &token);
    }
    else if (m_token.tk == tkDot && m_scriptContext->GetConfig()->IsESImportMetaEnabled())
    {
        BOOL fCanAssign;
        ParseMetaProperty<buildAST>(tkIMPORT, ichMin, &fCanAssign);
        this->GetScanner()->SeekTo(parsedImport);
        return ParseExpr<buildAST>();
    }

    this->GetScanner()->SeekTo(parsedImport);

    CheckIfImportOrExportStatementValidHere();

    // We just parsed an import token. Next valid token is *, {, string constant, or binding identifier.
    this->GetScanner()->Scan();

    if (m_token.tk == tkStrCon)
    {
        // This import declaration has no import clause.
        // "import ModuleSpecifier;"
        if (buildAST)
        {
            AddModuleSpecifier(m_token.GetStr());
        }

        // Scan past the module identifier.
        this->GetScanner()->Scan();
    }
    else
    {
        ModuleImportOrExportEntryList importEntryList(&m_nodeAllocator);

        // Parse the import clause (default binding can only exist before the comma).
        ParseImportClause<buildAST>(&importEntryList);

        // Token following import clause must be the identifier 'from'
        IdentPtr moduleSpecifier = ParseImportOrExportFromClause<buildAST>(true);

        if (buildAST)
        {
            Assert(moduleSpecifier != nullptr);

            AddModuleSpecifier(moduleSpecifier);

            importEntryList.Map([this, moduleSpecifier](ModuleImportOrExportEntry& importEntry) {
                importEntry.moduleRequest = moduleSpecifier;
                AddModuleImportOrExportEntry(EnsureModuleImportEntryList(), &importEntry);
            });
        }

        importEntryList.Clear();
    }

    // Import statement is actually a nop, we hoist all the imported bindings to the top of the module.
    return nullptr;
}